

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_read_file(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uchar uVar1;
  int iVar2;
  vm_val_t *this_00;
  vmobjfile_ext_t *pvVar3;
  vm_obj_id_t in_ESI;
  CVmObjFile *in_RDI;
  vm_val_t *in_stack_00000018;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  CVmRun *in_stack_ffffffffffffffd0;
  
  if ((getp_read_file(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_read_file(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_read_file::desc,0);
    __cxa_guard_release(&getp_read_file(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (uint *)in_RDI,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar2 == 0) {
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    check_valid_file(in_RDI);
    check_read_access((CVmObjFile *)0x2e08c3);
    note_file_seek(in_RDI,in_stack_ffffffffffffffbc);
    switch_read_write_mode((CVmObjFile *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    pvVar3 = get_ext(in_RDI);
    uVar1 = pvVar3->mode;
    if (uVar1 == '\x01') {
      read_text_mode((CVmObjFile *)argc,in_stack_00000018);
    }
    else if (uVar1 == '\x02') {
      read_data_mode((CVmObjFile *)argc,in_stack_00000018);
    }
    else if (uVar1 == '\x03') {
      CVmRun::throw_new_class
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (char *)in_RDI);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_read_file(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* check that we have read access */
    check_read_access(vmg0_);

    /* note the implicit seeking */
    note_file_seek(vmg_ FALSE);

    /* flush stdio buffers as needed and note the read operation */
    switch_read_write_mode(vmg_ FALSE);

    /* read according to our mode */
    switch(get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* read a line of text */
        read_text_mode(vmg_ retval);
        break;

    case VMOBJFILE_MODE_DATA:
        /* read in data mode */
        read_data_mode(vmg_ retval);
        break;

    case VMOBJFILE_MODE_RAW:
        /* can't use this call on this type of file */
        G_interpreter->throw_new_class(vmg_ G_predef->file_mode_exc,
                                       0, "wrong file mode");
        break;
    }

    /* discard the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}